

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array
          (Array<capnp::_::DirectWireValue<unsigned_int>_> *this)

{
  Array<capnp::_::DirectWireValue<unsigned_int>_> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }